

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::pipeContentStreams
          (QPDFObjectHandle *this,Pipeline *p,string *description,string *all_description)

{
  Pipeline *pPVar1;
  bool bVar2;
  QPDFExc *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  allocator<char> local_15a;
  allocator<char> local_159;
  Pipeline *local_158;
  QPDFObjectHandle stream;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> streams;
  LastChar lc;
  QPDFObjGen local_f0;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  Pl_Buffer buf;
  
  local_158 = p;
  arrayOrStreamToStreamArray(&streams,this,description,all_description);
  Pl_Buffer::Pl_Buffer(&buf,"concatenated content stream buffer",(Pipeline *)0x0);
  bVar2 = false;
  p_Var3 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (p_Var3 == (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                  streams.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      Pl_Buffer::getString_abi_cxx11_((string *)&lc,&buf);
      pPVar1 = local_158;
      Pipeline::writeString(local_158,(string *)&lc);
      std::__cxx11::string::~string((string *)&lc);
      (*pPVar1->_vptr_Pipeline[3])(pPVar1);
      Pl_Buffer::~Pl_Buffer(&buf);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&streams);
      return;
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stream,p_Var3);
    if (bVar2) {
      Pipeline::writeCStr(&buf.super_Pipeline,"\n");
    }
    Pipeline::Pipeline(&lc.super_Pipeline,"lastchar",&buf.super_Pipeline);
    lc.super_Pipeline._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002afb30;
    lc.last_char = '\0';
    bVar2 = pipeStreamData(&stream,&lc.super_Pipeline,0,qpdf_dl_specialized,false,false);
    if (!bVar2) break;
    (*(lc.super_Pipeline.next_)->_vptr_Pipeline[3])();
    bVar2 = lc.last_char != '\n';
    Pipeline::~Pipeline(&lc.super_Pipeline);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&stream.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    p_Var3 = p_Var3 + 1;
  }
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"content stream",&local_159);
  if (stream.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    local_f0.obj = 0;
    local_f0.gen = 0;
  }
  else {
    local_f0 = (stream.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
  }
  QPDFObjGen::unparse_abi_cxx11_(&local_c8,&local_f0,' ');
  std::operator+(&local_a8,"content stream object ",&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"errors while decoding content stream",&local_15a);
  QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,&local_88,&local_a8,0,&local_e8);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDFObjectHandle::pipeContentStreams(
    Pipeline* p, std::string const& description, std::string& all_description)
{
    std::vector<QPDFObjectHandle> streams =
        arrayOrStreamToStreamArray(description, all_description);
    bool need_newline = false;
    Pl_Buffer buf("concatenated content stream buffer");
    for (auto stream: streams) {
        if (need_newline) {
            buf.writeCStr("\n");
        }
        LastChar lc(buf);
        if (!stream.pipeStreamData(&lc, 0, qpdf_dl_specialized)) {
            QTC::TC("qpdf", "QPDFObjectHandle errors in parsecontent");
            throw QPDFExc(
                qpdf_e_damaged_pdf,
                "content stream",
                "content stream object " + stream.getObjGen().unparse(' '),
                0,
                "errors while decoding content stream");
        }
        lc.finish();
        need_newline = (lc.getLastChar() != static_cast<unsigned char>('\n'));
        QTC::TC("qpdf", "QPDFObjectHandle need_newline", need_newline ? 0 : 1);
    }
    p->writeString(buf.getString());
    p->finish();
}